

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O2

CURLUcode curl_url_set(CURLU *u,CURLUPart what,char *part,uint flags)

{
  byte bVar1;
  byte bVar2;
  char *pcVar3;
  uint uVar4;
  _Bool _Var5;
  byte bVar6;
  char cVar7;
  CURLcode CVar8;
  CURLUcode CVar9;
  size_t sVar10;
  Curl_handler *pCVar11;
  int *piVar12;
  ulong uVar13;
  char *pcVar14;
  size_t sVar15;
  char *pcVar16;
  char *pcVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  long lVar22;
  int iVar23;
  char **mem;
  uchar *i;
  bool bVar24;
  size_t sStack_b0;
  uint local_a0;
  _Bool local_9c;
  CURLU *local_98;
  char *decoded;
  char *endp;
  uint local_54;
  char *oldurl;
  
  if (u == (CURLU *)0x0) {
    return CURLUE_BAD_HANDLE;
  }
  uVar13 = (ulong)what;
  if (part == (char *)0x0) {
    switch(uVar13) {
    case 0:
      free_urlhandle(u);
      u->query = (char *)0x0;
      u->fragment = (char *)0x0;
      u->port = (char *)0x0;
      u->path = (char *)0x0;
      u->host = (char *)0x0;
      u->zoneid = (char *)0x0;
      u->password = (char *)0x0;
      u->options = (char *)0x0;
      u->scheme = (char *)0x0;
      u->user = (char *)0x0;
      *(undefined8 *)&u->portnum = 0;
      return CURLUE_OK;
    case 1:
      u->field_0x52 = u->field_0x52 & 0xfb;
      break;
    case 2:
      u = (CURLU *)&u->user;
      break;
    case 3:
      u = (CURLU *)&u->password;
      break;
    case 4:
      u = (CURLU *)&u->options;
      break;
    case 5:
      u = (CURLU *)&u->host;
      break;
    case 6:
      u->portnum = 0;
      u = (CURLU *)&u->port;
      break;
    case 7:
      u = (CURLU *)&u->path;
      break;
    case 8:
      u->field_0x52 = u->field_0x52 & 0xfe;
      u = (CURLU *)&u->query;
      break;
    case 9:
      u->field_0x52 = u->field_0x52 & 0xfd;
      u = (CURLU *)&u->fragment;
      break;
    case 10:
      u = (CURLU *)&u->zoneid;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if (u->scheme != (char *)0x0) {
      (*Curl_cfree)(u->scheme);
      u->scheme = (char *)0x0;
      return CURLUE_OK;
    }
    return CURLUE_OK;
  }
  sVar10 = strlen(part);
  if (8000000 < sVar10) {
    return CURLUE_MALFORMED_INPUT;
  }
  if (CURLUPART_ZONEID < what) {
    return CURLUE_UNKNOWN_PART;
  }
  bVar6 = (byte)flags >> 7;
  switch(uVar13) {
  case 0:
    if (sVar10 == 0) {
      return CURLUE_MALFORMED_INPUT;
    }
    sVar15 = Curl_is_absolute_url(part,(char *)0x0,(ulong)flags,(flags & 0x204) != 0);
    if ((sVar15 != 0) || (CVar9 = curl_url_get(u,CURLUPART_URL,&oldurl,flags), CVar9 != CURLUE_OK))
    {
      CVar9 = parseurl_and_replace(part,u,flags);
      return CVar9;
    }
    pcVar3 = (char *)CONCAT53(oldurl._3_5_,
                              CONCAT12(oldurl._2_1_,CONCAT11(oldurl._1_1_,oldurl._0_1_)));
    pcVar16 = strstr(pcVar3,"//");
    pcVar14 = pcVar16 + 2;
    if (pcVar16 == (char *)0x0) {
      pcVar14 = pcVar3;
    }
    cVar7 = *part;
    if (cVar7 == '/') {
      pcVar16 = pcVar14;
      if (part[1] == '/') {
        *pcVar14 = '\0';
        part = part + 2;
        _Var5 = false;
      }
      else {
        pcVar17 = strchr(pcVar14,0x2f);
        pcVar14 = strchr(pcVar14,0x3f);
        if (pcVar17 == (char *)0x0) {
          _Var5 = true;
          if (pcVar14 != (char *)0x0) {
            *pcVar14 = '\0';
          }
        }
        else {
          pcVar21 = pcVar17;
          if (pcVar14 < pcVar17) {
            pcVar21 = pcVar14;
          }
          if (pcVar14 == (char *)0x0) {
            pcVar21 = pcVar17;
          }
          *pcVar21 = '\0';
          _Var5 = true;
        }
      }
LAB_0015e815:
      local_9c = _Var5;
      pcVar14 = pcVar16;
      bVar24 = false;
    }
    else {
      pcVar16 = strchr(pcVar14,0x3f);
      if (pcVar16 != (char *)0x0) {
        *pcVar16 = '\0';
        cVar7 = *part;
      }
      local_9c = true;
      if ((cVar7 != '#') && (cVar7 != '?')) {
        pcVar16 = strrchr(pcVar14,0x2f);
        if (pcVar16 != (char *)0x0) {
          *pcVar16 = '\0';
          cVar7 = *part;
        }
        pcVar17 = strchr(pcVar14,0x2f);
        pcVar14 = pcVar17 + 1;
        pcVar16 = pcVar14;
        if (pcVar17 == (char *)0x0) {
          pcVar16 = (char *)0x0;
        }
        if (cVar7 == '.') {
          part = part + (ulong)(part[1] == '/') * 2;
        }
        iVar23 = 0;
        for (; ((*part == '.' && (part[1] == '.')) && (part[2] == '/')); part = part + 3) {
          iVar23 = iVar23 + -1;
        }
        _Var5 = true;
        if (pcVar17 == (char *)0x0) {
          pcVar16 = (char *)0x0;
        }
        else {
          for (; iVar23 != 0; iVar23 = iVar23 + 1) {
            pcVar17 = strrchr(pcVar16,0x2f);
            if (pcVar17 == (char *)0x0) {
              *pcVar16 = '\0';
              bVar24 = false;
              goto LAB_0015e817;
            }
            *pcVar17 = '\0';
          }
        }
        goto LAB_0015e815;
      }
      bVar24 = true;
    }
LAB_0015e817:
    Curl_dyn_init((dynbuf *)&endp,8000000);
    CVar8 = Curl_dyn_add((dynbuf *)&endp,pcVar3);
    if (CVar8 == CURLE_OK) {
      if (*part != '/') {
        if (pcVar14 == (char *)0x0) {
          if (!bVar24) goto LAB_0015e859;
        }
        else if (!bVar24 && *pcVar14 != '\0') {
LAB_0015e859:
          CVar8 = Curl_dyn_addn((dynbuf *)&endp,"/",1);
          if (CVar8 != CURLE_OK) goto LAB_0015e8a3;
        }
      }
      sVar10 = strlen(part);
      CVar8 = CURLE_OK;
      CVar9 = urlencode_str((dynbuf *)&endp,part,sVar10,local_9c,false);
      if (CVar9 != CURLUE_OK) {
        CVar8 = CURLE_OUT_OF_MEMORY;
        if (CVar9 == CURLUE_TOO_LARGE) {
          CVar8 = CURLE_TOO_LARGE;
        }
        goto LAB_0015e8a3;
      }
      pcVar14 = Curl_dyn_ptr((dynbuf *)&endp);
    }
    else {
LAB_0015e8a3:
      pcVar14 = (char *)0x0;
    }
    (*Curl_cfree)((void *)CONCAT53(oldurl._3_5_,
                                   CONCAT12(oldurl._2_1_,CONCAT11(oldurl._1_1_,oldurl._0_1_))));
    if (CVar8 == CURLE_OK) {
      CVar9 = parseurl_and_replace(pcVar14,u,flags);
      (*Curl_cfree)(pcVar14);
      return CVar9;
    }
    goto LAB_0015e3e3;
  case 1:
    if (sVar10 - 0x29 < 0xffffffffffffffd8) {
      return CURLUE_BAD_SCHEME;
    }
    if (((flags & 8) == 0) &&
       (pCVar11 = Curl_get_scheme_handler(part), pCVar11 == (Curl_handler *)0x0)) {
      return CURLUE_UNSUPPORTED_SCHEME;
    }
    if (0x19 < (byte)((*part & 0xdfU) + 0xbf)) {
      return CURLUE_BAD_SCHEME;
    }
    for (lVar20 = 0; sVar10 - 1 != lVar20; lVar20 = lVar20 + 1) {
      bVar6 = part[lVar20];
      if ((9 < (byte)(bVar6 - 0x30)) && (0x19 < (byte)((bVar6 & 0xdf) + 0xbf))) {
        if (0x2e < bVar6) {
          return CURLUE_BAD_SCHEME;
        }
        if ((0x680000000000U >> ((ulong)bVar6 & 0x3f) & 1) == 0) {
          return CURLUE_BAD_SCHEME;
        }
      }
    }
    u->field_0x52 = u->field_0x52 & 0xfb;
    bVar24 = true;
    local_a0 = 0;
    uVar18 = 0;
    bVar6 = 0;
    local_98 = u;
    goto LAB_0015e289;
  case 2:
    local_98 = (CURLU *)&u->user;
    break;
  case 3:
    local_98 = (CURLU *)&u->password;
    break;
  case 4:
    local_98 = (CURLU *)&u->options;
    break;
  case 5:
    local_98 = (CURLU *)&u->host;
    (*Curl_cfree)(u->zoneid);
    u->zoneid = (char *)0x0;
    break;
  case 6:
    if (9 < (byte)(*part - 0x30U)) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    piVar12 = __errno_location();
    *piVar12 = 0;
    uVar13 = strtoul(part,&endp,10);
    if (0xffff < uVar13 || *piVar12 != 0) {
      return CURLUE_BAD_PORT_NUMBER;
    }
    if (*endp != '\0') {
      return CURLUE_BAD_PORT_NUMBER;
    }
    pcVar14 = (*Curl_cstrdup)(part);
    if (pcVar14 == (char *)0x0) {
      return CURLUE_OUT_OF_MEMORY;
    }
    (*Curl_cfree)(u->port);
    u->port = pcVar14;
    u->portnum = (unsigned_short)uVar13;
    return CURLUE_OK;
  case 7:
    local_98 = (CURLU *)&u->path;
    uVar18 = (uint)CONCAT71((int7)((ulong)((long)&switchD_0015e042::switchdataD_00175b0c +
                                          (long)(int)(&switchD_0015e042::switchdataD_00175b0c)
                                                     [uVar13]) >> 8),1);
    local_a0 = 0;
    bVar24 = true;
    goto LAB_0015e289;
  case 8:
    bVar24 = -1 < (char)(byte)flags;
    local_a0 = flags >> 8;
    local_98 = (CURLU *)&u->query;
    u->field_0x52 = u->field_0x52 | 1;
    goto LAB_0015e287;
  case 9:
    u->field_0x52 = u->field_0x52 | 2;
    local_98 = (CURLU *)&u->fragment;
    break;
  case 10:
    local_98 = (CURLU *)&u->zoneid;
  }
  bVar24 = true;
  local_a0 = 0;
LAB_0015e287:
  uVar18 = 0;
LAB_0015e289:
  local_54 = uVar18;
  Curl_dyn_init((dynbuf *)&endp,(ulong)(uVar18 & 0xff) + sVar10 * 3 + 1);
  if (((char)uVar18 != '\0') && (*part != '/')) {
    CVar8 = Curl_dyn_addn((dynbuf *)&endp,"/",1);
    CVar9 = CURLUE_OUT_OF_MEMORY;
    if (CVar8 == CURLE_TOO_LARGE) {
      CVar9 = CURLUE_TOO_LARGE;
    }
    if (CVar8 != CURLE_OK) {
      return CVar9;
    }
  }
  if (bVar6 == 0) {
    CVar8 = Curl_dyn_add((dynbuf *)&endp,part);
    if (CVar8 == CURLE_OK) {
      pcVar14 = Curl_dyn_ptr((dynbuf *)&endp);
      lVar20 = 1;
      do {
        lVar22 = lVar20;
        if (*pcVar14 == '%') {
          bVar1 = pcVar14[1];
          if (((((byte)(bVar1 - 0x30) < 10) ||
               ((bVar1 - 0x41 < 0x26 && ((0x3f0000003fU >> ((ulong)(bVar1 - 0x41) & 0x3f) & 1) != 0)
                ))) && ((bVar2 = pcVar14[2], (byte)(bVar2 - 0x30) < 10 ||
                        ((bVar2 - 0x41 < 0x26 &&
                         ((0x3f0000003fU >> ((ulong)(bVar2 - 0x41) & 0x3f) & 1) != 0)))))) &&
             ((byte)(bVar1 + 0xbf) < 0x1a || (byte)(bVar2 + 0xbf) < 0x1a)) {
            cVar7 = Curl_raw_tolower(bVar1);
            pcVar14[1] = cVar7;
            cVar7 = Curl_raw_tolower(pcVar14[2]);
            pcVar14[2] = cVar7;
            lVar22 = 3;
          }
        }
        else if (*pcVar14 == '\0') goto LAB_0015e4b5;
        pcVar14 = pcVar14 + lVar22;
      } while( true );
    }
LAB_0015e3e3:
    if (CVar8 == CURLE_TOO_LARGE) {
      return CURLUE_TOO_LARGE;
    }
    return CURLUE_OUT_OF_MEMORY;
  }
  uVar18 = local_a0;
  for (; bVar1 = *part, bVar1 != 0; part = (char *)((long)part + 1)) {
    if ((bool)(bVar1 != 0x20 | bVar24)) {
      if (((((byte)(bVar1 - 0x30) < 10) || ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) ||
          (bVar1 - 0x2d < 2)) || (bVar1 == 0x7e)) {
LAB_0015e39d:
        uVar19 = uVar18 & 0xff;
        uVar4 = uVar19;
        if ((uVar18 & 1) != 0) {
          uVar4 = 0;
        }
        uVar18 = uVar4;
        if (bVar1 != 0x3d) {
          uVar18 = uVar19;
        }
        sStack_b0 = 1;
        mem = (char **)part;
      }
      else {
        if (bVar1 == 0x3d) {
          if ((uVar18 & 1) != 0) goto LAB_0015e39d;
        }
        else if ((bVar1 == 0x5f) || ((bVar1 == 0x2f && ((char)local_54 != '\0'))))
        goto LAB_0015e39d;
        oldurl._0_1_ = 0x25;
        oldurl._1_1_ = "0123456789abcdef"[bVar1 >> 4];
        oldurl._2_1_ = "0123456789abcdef"[bVar1 & 0xf];
        sStack_b0 = 3;
        mem = &oldurl;
      }
      CVar8 = Curl_dyn_addn((dynbuf *)&endp,mem,sStack_b0);
      if (CVar8 != CURLE_OK) goto LAB_0015e3e3;
    }
    else {
      CVar8 = Curl_dyn_addn((dynbuf *)&endp,"+",1);
      if (CVar8 != CURLE_OK) {
        return CURLUE_OUT_OF_MEMORY;
      }
    }
  }
LAB_0015e4b5:
  pcVar14 = Curl_dyn_ptr((dynbuf *)&endp);
  if (((byte)local_a0 & pcVar14 != (char *)0x0) == 1) {
    pcVar3 = u->query;
    if ((pcVar3 != (char *)0x0) && (sVar10 = strlen(pcVar3), sVar10 != 0)) {
      cVar7 = pcVar3[sVar10 - 1];
      Curl_dyn_init((dynbuf *)&oldurl,8000000);
      CVar8 = Curl_dyn_addn((dynbuf *)&oldurl,u->query,sVar10);
      if ((CVar8 == CURLE_OK) &&
         (((cVar7 == '&' || (CVar8 = Curl_dyn_addn((dynbuf *)&oldurl,"&",1), CVar8 == CURLE_OK)) &&
          (CVar8 = Curl_dyn_add((dynbuf *)&oldurl,pcVar14), CVar8 == CURLE_OK)))) {
        Curl_dyn_free((dynbuf *)&endp);
        (*Curl_cfree)(local_98->scheme);
        pcVar14 = Curl_dyn_ptr((dynbuf *)&oldurl);
        local_98->scheme = pcVar14;
        return CURLUE_OK;
      }
      Curl_dyn_free((dynbuf *)&endp);
      return CURLUE_OUT_OF_MEMORY;
    }
  }
  else if ((what == CURLUPART_HOST) &&
          (sVar15 = Curl_dyn_len((dynbuf *)&endp), ((byte)(flags >> 10) & sVar15 == 0) == 0)) {
    if (sVar15 == 0) {
LAB_0015e653:
      Curl_dyn_free((dynbuf *)&endp);
      return CURLUE_BAD_HOSTNAME;
    }
    if (bVar6 == 0) {
      decoded = (char *)0x0;
      CVar8 = Curl_urldecode(pcVar14,sVar15,&decoded,(size_t *)&oldurl,REJECT_CTRL);
      if ((CVar8 != CURLE_OK) ||
         (CVar9 = hostname_check(u,decoded,
                                 CONCAT53(oldurl._3_5_,
                                          CONCAT12(oldurl._2_1_,CONCAT11(oldurl._1_1_,oldurl._0_1_))
                                         )), CVar9 != CURLUE_OK)) {
        (*Curl_cfree)(decoded);
        goto LAB_0015e653;
      }
      (*Curl_cfree)(decoded);
    }
    else {
      CVar9 = hostname_check(u,pcVar14,sVar15);
      if (CVar9 != CURLUE_OK) goto LAB_0015e653;
    }
  }
  (*Curl_cfree)(local_98->scheme);
  local_98->scheme = pcVar14;
  return CURLUE_OK;
}

Assistant:

CURLUcode curl_url_set(CURLU *u, CURLUPart what,
                       const char *part, unsigned int flags)
{
  char **storep = NULL;
  bool urlencode = (flags & CURLU_URLENCODE)? 1 : 0;
  bool plusencode = FALSE;
  bool urlskipslash = FALSE;
  bool leadingslash = FALSE;
  bool appendquery = FALSE;
  bool equalsencode = FALSE;
  size_t nalloc;

  if(!u)
    return CURLUE_BAD_HANDLE;
  if(!part) {
    /* setting a part to NULL clears it */
    switch(what) {
    case CURLUPART_URL:
      break;
    case CURLUPART_SCHEME:
      storep = &u->scheme;
      u->guessed_scheme = FALSE;
      break;
    case CURLUPART_USER:
      storep = &u->user;
      break;
    case CURLUPART_PASSWORD:
      storep = &u->password;
      break;
    case CURLUPART_OPTIONS:
      storep = &u->options;
      break;
    case CURLUPART_HOST:
      storep = &u->host;
      break;
    case CURLUPART_ZONEID:
      storep = &u->zoneid;
      break;
    case CURLUPART_PORT:
      u->portnum = 0;
      storep = &u->port;
      break;
    case CURLUPART_PATH:
      storep = &u->path;
      break;
    case CURLUPART_QUERY:
      storep = &u->query;
      u->query_present = FALSE;
      break;
    case CURLUPART_FRAGMENT:
      storep = &u->fragment;
      u->fragment_present = FALSE;
      break;
    default:
      return CURLUE_UNKNOWN_PART;
    }
    if(storep && *storep) {
      Curl_safefree(*storep);
    }
    else if(!storep) {
      free_urlhandle(u);
      memset(u, 0, sizeof(struct Curl_URL));
    }
    return CURLUE_OK;
  }

  nalloc = strlen(part);
  if(nalloc > CURL_MAX_INPUT_LENGTH)
    /* excessive input length */
    return CURLUE_MALFORMED_INPUT;

  switch(what) {
  case CURLUPART_SCHEME: {
    size_t plen = strlen(part);
    const char *s = part;
    if((plen > MAX_SCHEME_LEN) || (plen < 1))
      /* too long or too short */
      return CURLUE_BAD_SCHEME;
   /* verify that it is a fine scheme */
    if(!(flags & CURLU_NON_SUPPORT_SCHEME) && !Curl_get_scheme_handler(part))
      return CURLUE_UNSUPPORTED_SCHEME;
    storep = &u->scheme;
    urlencode = FALSE; /* never */
    if(ISALPHA(*s)) {
      /* ALPHA *( ALPHA / DIGIT / "+" / "-" / "." ) */
      while(--plen) {
        if(ISALNUM(*s) || (*s == '+') || (*s == '-') || (*s == '.'))
          s++; /* fine */
        else
          return CURLUE_BAD_SCHEME;
      }
    }
    else
      return CURLUE_BAD_SCHEME;
    u->guessed_scheme = FALSE;
    break;
  }
  case CURLUPART_USER:
    storep = &u->user;
    break;
  case CURLUPART_PASSWORD:
    storep = &u->password;
    break;
  case CURLUPART_OPTIONS:
    storep = &u->options;
    break;
  case CURLUPART_HOST:
    storep = &u->host;
    Curl_safefree(u->zoneid);
    break;
  case CURLUPART_ZONEID:
    storep = &u->zoneid;
    break;
  case CURLUPART_PORT:
    if(!ISDIGIT(part[0]))
      /* not a number */
      return CURLUE_BAD_PORT_NUMBER;
    else {
      char *tmp;
      char *endp;
      unsigned long port;
      errno = 0;
      port = strtoul(part, &endp, 10);  /* must be decimal */
      if(errno || (port > 0xffff) || *endp)
        /* weirdly provided number, not good! */
        return CURLUE_BAD_PORT_NUMBER;
      tmp = strdup(part);
      if(!tmp)
        return CURLUE_OUT_OF_MEMORY;
      free(u->port);
      u->port = tmp;
      u->portnum = (unsigned short)port;
      return CURLUE_OK;
    }
  case CURLUPART_PATH:
    urlskipslash = TRUE;
    leadingslash = TRUE; /* enforce */
    storep = &u->path;
    break;
  case CURLUPART_QUERY:
    plusencode = urlencode;
    appendquery = (flags & CURLU_APPENDQUERY)?1:0;
    equalsencode = appendquery;
    storep = &u->query;
    u->query_present = TRUE;
    break;
  case CURLUPART_FRAGMENT:
    storep = &u->fragment;
    u->fragment_present = TRUE;
    break;
  case CURLUPART_URL: {
    /*
     * Allow a new URL to replace the existing (if any) contents.
     *
     * If the existing contents is enough for a URL, allow a relative URL to
     * replace it.
     */
    CURLcode result;
    CURLUcode uc;
    char *oldurl;
    char *redired_url;

    if(!nalloc)
      /* a blank URL is not a valid URL */
      return CURLUE_MALFORMED_INPUT;

    /* if the new thing is absolute or the old one is not
     * (we could not get an absolute URL in 'oldurl'),
     * then replace the existing with the new. */
    if(Curl_is_absolute_url(part, NULL, 0,
                            flags & (CURLU_GUESS_SCHEME|
                                     CURLU_DEFAULT_SCHEME))
       || curl_url_get(u, CURLUPART_URL, &oldurl, flags)) {
      return parseurl_and_replace(part, u, flags);
    }

    /* apply the relative part to create a new URL
     * and replace the existing one with it. */
    result = concat_url(oldurl, part, &redired_url);
    free(oldurl);
    if(result)
      return cc2cu(result);

    uc = parseurl_and_replace(redired_url, u, flags);
    free(redired_url);
    return uc;
  }
  default:
    return CURLUE_UNKNOWN_PART;
  }
  DEBUGASSERT(storep);
  {
    const char *newp;
    struct dynbuf enc;
    Curl_dyn_init(&enc, nalloc * 3 + 1 + leadingslash);

    if(leadingslash && (part[0] != '/')) {
      CURLcode result = Curl_dyn_addn(&enc, "/", 1);
      if(result)
        return cc2cu(result);
    }
    if(urlencode) {
      const unsigned char *i;

      for(i = (const unsigned char *)part; *i; i++) {
        CURLcode result;
        if((*i == ' ') && plusencode) {
          result = Curl_dyn_addn(&enc, "+", 1);
          if(result)
            return CURLUE_OUT_OF_MEMORY;
        }
        else if(ISUNRESERVED(*i) ||
                ((*i == '/') && urlskipslash) ||
                ((*i == '=') && equalsencode)) {
          if((*i == '=') && equalsencode)
            /* only skip the first equals sign */
            equalsencode = FALSE;
          result = Curl_dyn_addn(&enc, i, 1);
          if(result)
            return cc2cu(result);
        }
        else {
          char out[3]={'%'};
          out[1] = hexdigits[*i>>4];
          out[2] = hexdigits[*i & 0xf];
          result = Curl_dyn_addn(&enc, out, 3);
          if(result)
            return cc2cu(result);
        }
      }
    }
    else {
      char *p;
      CURLcode result = Curl_dyn_add(&enc, part);
      if(result)
        return cc2cu(result);
      p = Curl_dyn_ptr(&enc);
      while(*p) {
        /* make sure percent encoded are lower case */
        if((*p == '%') && ISXDIGIT(p[1]) && ISXDIGIT(p[2]) &&
           (ISUPPER(p[1]) || ISUPPER(p[2]))) {
          p[1] = Curl_raw_tolower(p[1]);
          p[2] = Curl_raw_tolower(p[2]);
          p += 3;
        }
        else
          p++;
      }
    }
    newp = Curl_dyn_ptr(&enc);

    if(appendquery && newp) {
      /* Append the 'newp' string onto the old query. Add a '&' separator if
         none is present at the end of the existing query already */

      size_t querylen = u->query ? strlen(u->query) : 0;
      bool addamperand = querylen && (u->query[querylen -1] != '&');
      if(querylen) {
        struct dynbuf qbuf;
        Curl_dyn_init(&qbuf, CURL_MAX_INPUT_LENGTH);

        if(Curl_dyn_addn(&qbuf, u->query, querylen)) /* add original query */
          goto nomem;

        if(addamperand) {
          if(Curl_dyn_addn(&qbuf, "&", 1))
            goto nomem;
        }
        if(Curl_dyn_add(&qbuf, newp))
          goto nomem;
        Curl_dyn_free(&enc);
        free(*storep);
        *storep = Curl_dyn_ptr(&qbuf);
        return CURLUE_OK;
nomem:
        Curl_dyn_free(&enc);
        return CURLUE_OUT_OF_MEMORY;
      }
    }

    else if(what == CURLUPART_HOST) {
      size_t n = Curl_dyn_len(&enc);
      if(!n && (flags & CURLU_NO_AUTHORITY)) {
        /* Skip hostname check, it is allowed to be empty. */
      }
      else {
        bool bad = FALSE;
        if(!n)
          bad = TRUE; /* empty hostname is not okay */
        else if(!urlencode) {
          /* if the host name part was not URL encoded here, it was set ready
             URL encoded so we need to decode it to check */
          size_t dlen;
          char *decoded = NULL;
          CURLcode result =
            Curl_urldecode(newp, n, &decoded, &dlen, REJECT_CTRL);
          if(result || hostname_check(u, decoded, dlen))
            bad = TRUE;
          free(decoded);
        }
        else if(hostname_check(u, (char *)newp, n))
          bad = TRUE;
        if(bad) {
          Curl_dyn_free(&enc);
          return CURLUE_BAD_HOSTNAME;
        }
      }
    }

    free(*storep);
    *storep = (char *)newp;
  }
  return CURLUE_OK;
}